

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O0

int __thiscall ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  double dVar3;
  float fVar4;
  int i_1;
  float b;
  float a;
  float beta;
  float gamma;
  float var;
  float mean;
  int i;
  float sqsum;
  float sum;
  float *ptr;
  int q;
  int size;
  int h;
  int w;
  float in_stack_ffffffffffffff54;
  Mat *this_00;
  int local_8c;
  int local_70;
  float local_6c;
  float local_68;
  Mat local_58;
  float *local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = *(int *)(in_RSI + 0x1c);
  local_18 = *(int *)(in_RSI + 0x20);
  local_1c = local_14 * local_18;
  for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x80); local_20 = local_20 + 1) {
    this_00 = &local_58;
    Mat::channel(this_00,(int)in_stack_ffffffffffffff54);
    pfVar2 = Mat::operator_cast_to_float_(this_00);
    Mat::~Mat((Mat *)0x14e25a);
    local_68 = 0.0;
    local_6c = 0.0;
    for (local_70 = 0; local_70 < local_1c; local_70 = local_70 + 1) {
      local_68 = pfVar2[local_70] + local_68;
      local_6c = pfVar2[local_70] * pfVar2[local_70] + local_6c;
    }
    local_68 = local_68 / (float)local_1c;
    fVar4 = (float)local_1c;
    local_28 = pfVar2;
    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x88),local_20);
    in_stack_ffffffffffffff54 = *pfVar2;
    pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0xb8),local_20);
    fVar1 = *pfVar2;
    dVar3 = std::sqrt((double)(ulong)(uint)(local_6c / fVar4 - local_68 * local_68));
    fVar4 = in_stack_ffffffffffffff54 / (SUB84(dVar3,0) + *(float *)(in_RDI + 0x84));
    for (local_8c = 0; local_8c < local_1c; local_8c = local_8c + 1) {
      local_28[local_8c] = local_28[local_8c] * fVar4 + -local_68 * fVar4 + fVar1;
    }
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob) const
{
    // x = (x - mean) / (sqrt(var) + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i=0; i<size; i++)
        {
            sum += ptr[i];
            sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float var = sqsum / size - mean * mean;

        float gamma = gamma_data[q];
        float beta = beta_data[q];

        float a = gamma / (sqrt(var) + eps);
        float b = - mean * a + beta;

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}